

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O1

bool ImNodes::Connection(void *input_node,char *input_slot,void *output_node,char *output_slot)

{
  Pair **ppPVar1;
  undefined8 *puVar2;
  int iVar3;
  ImGuiStorage *this;
  Pair *pPVar4;
  long lVar5;
  float *pfVar6;
  _IgnoreSlot *p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ImU32 IVar11;
  int iVar12;
  void *__dest;
  int iVar13;
  long lVar14;
  _IgnoreSlot *p_Var15;
  _IgnoreSlot *this_00;
  char *__s2;
  float fVar16;
  float fVar17;
  int pending_slot_kind;
  char *pending_slot_title;
  void *pending_node_id;
  ImVec2 output_slot_pos;
  ImVec2 input_slot_pos;
  int local_7c;
  _IgnoreSlot local_78;
  char *local_58;
  char *local_50;
  void *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pfVar6 = gCanvas;
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,600,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_node == (void *)0x0) {
    __assert_fail("input_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x259,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_slot == (char *)0x0) {
    __assert_fail("input_slot != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x25a,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (output_node == (void *)0x0) {
    __assert_fail("output_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x25b,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (output_slot == (char *)0x0) {
    __assert_fail("output_slot != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x25c,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  this = *(ImGuiStorage **)(gCanvas + 0x26);
  pPVar4 = this[3].Data.Data;
  if (pPVar4 == (Pair *)output_node || pPVar4 == (Pair *)input_node) {
    return true;
  }
  IVar11 = MakeSlotDataID("x",input_slot,input_node,true);
  fVar16 = ImGuiStorage::GetFloat(this,IVar11,0.0);
  IVar11 = MakeSlotDataID("y",input_slot,input_node,true);
  local_38.y = ImGuiStorage::GetFloat(this,IVar11,0.0);
  local_38.x = fVar16;
  IVar11 = MakeSlotDataID("x",output_slot,output_node,false);
  fVar17 = ImGuiStorage::GetFloat(this,IVar11,0.0);
  local_50 = output_slot;
  IVar11 = MakeSlotDataID("y",output_slot,output_node,false);
  local_40.y = ImGuiStorage::GetFloat(this,IVar11,0.0);
  local_38.x = fVar16 + pfVar6[0x24] * *pfVar6;
  local_40.x = fVar17 - pfVar6[0x24] * *pfVar6;
  bVar8 = RenderConnection(&local_38,&local_40,pfVar6[0x23]);
  bVar10 = true;
  if ((bVar8) && (bVar9 = ImGui::IsWindowHovered(0), bVar9)) {
    bVar10 = ImGui::IsMouseDoubleClicked(0);
    bVar10 = !bVar10;
  }
  IVar11 = MakeSlotDataID("hovered",input_slot,input_node,true);
  ImGuiStorage::SetFloat(this,IVar11,(float)(byte)(bVar8 & bVar10));
  __s2 = local_50;
  IVar11 = MakeSlotDataID("hovered",local_50,output_node,false);
  ImGuiStorage::SetFloat(this,IVar11,(float)(byte)(bVar8 & bVar10));
  bVar8 = GetPendingConnection(&local_48,&local_58,&local_7c);
  if (!bVar8) {
    return bVar10;
  }
  local_78.node_id = (void *)0x0;
  local_78.slot_name = (char *)0x0;
  local_78.slot_kind = 0;
  local_78._20_4_ = 0;
  if (local_7c < 0) {
    if ((local_48 != input_node) || (iVar12 = strcmp(local_58,input_slot), iVar12 != 0))
    goto LAB_001548c2;
    iVar12 = 1;
    input_node = output_node;
  }
  else {
    if ((local_48 != output_node) || (iVar12 = strcmp(local_58,__s2), iVar12 != 0))
    goto LAB_001548c2;
    iVar12 = -1;
    __s2 = input_slot;
  }
  local_78.slot_kind = iVar12;
  local_78.node_id = input_node;
  local_78.slot_name = __s2;
LAB_001548c2:
  if (local_78.node_id != (void *)0x0) {
    p_Var15 = *(_IgnoreSlot **)&this[10].Data + *(int *)&this[9].Data.Data;
    p_Var7 = *(_IgnoreSlot **)&this[10].Data;
    do {
      this_00 = p_Var7;
      if (p_Var15 <= this_00) goto LAB_00154914;
      bVar8 = _IgnoreSlot::operator==(this_00,&local_78);
      p_Var7 = this_00 + 1;
    } while (!bVar8);
    if (p_Var15 <= this_00) {
LAB_00154914:
      iVar12 = *(int *)&this[9].Data.Data;
      iVar3 = *(int *)((long)&this[9].Data.Data + 4);
      if (iVar12 == iVar3) {
        iVar12 = iVar12 + 1;
        if (iVar3 == 0) {
          iVar13 = 8;
        }
        else {
          iVar13 = iVar3 / 2 + iVar3;
        }
        if (iVar12 < iVar13) {
          iVar12 = iVar13;
        }
        if (iVar3 < iVar12) {
          __dest = ImGui::MemAlloc((long)iVar12 * 0x18);
          if (*(void **)&this[10].Data != (void *)0x0) {
            memcpy(__dest,*(void **)&this[10].Data,(long)*(int *)&this[9].Data.Data * 0x18);
            ImGui::MemFree(*(void **)&this[10].Data);
          }
          *(void **)&this[10].Data = __dest;
          *(int *)((long)&this[9].Data.Data + 4) = iVar12;
        }
      }
      lVar5 = *(long *)&this[10].Data;
      lVar14 = (long)*(int *)&this[9].Data.Data;
      *(undefined8 *)(lVar5 + 0x10 + lVar14 * 0x18) = local_78._16_8_;
      puVar2 = (undefined8 *)(lVar5 + lVar14 * 0x18);
      *puVar2 = local_78.node_id;
      puVar2[1] = local_78.slot_name;
      ppPVar1 = &this[9].Data.Data;
      *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
    }
  }
  return bVar10;
}

Assistant:

bool Connection(void* input_node, const char* input_slot, void* output_node, const char* output_slot)
{
    assert(gCanvas != nullptr);
    assert(input_node != nullptr);
    assert(input_slot != nullptr);
    assert(output_node != nullptr);
    assert(output_slot != nullptr);

    bool is_connected = true;
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (input_node == impl->auto_position_node_id || output_node == impl->auto_position_node_id)
        // Do not render connection to newly added output node because node is rendered outside of screen on the first frame and will be repositioned.
        return is_connected;

    ImVec2 input_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", input_slot, input_node, true)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", input_slot, input_node, true)),
    };

    ImVec2 output_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", output_slot, output_node, false)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", output_slot, output_node, false)),
    };

    // Indent connection a bit into slot widget.
    float connection_indent = canvas->style.connection_indent * canvas->zoom;
    input_slot_pos.x += connection_indent;
    output_slot_pos.x -= connection_indent;

    bool curve_hovered = RenderConnection(input_slot_pos, output_slot_pos, canvas->style.curve_thickness);
    if (curve_hovered && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDoubleClicked(0))
            is_connected = false;
    }

    impl->cached_data.SetFloat(MakeSlotDataID("hovered", input_slot, input_node, true), curve_hovered && is_connected);
    impl->cached_data.SetFloat(MakeSlotDataID("hovered", output_slot, output_node, false), curve_hovered && is_connected);

    void* pending_node_id;
    const char* pending_slot_title;
    int pending_slot_kind;
    if (GetPendingConnection(&pending_node_id, &pending_slot_title, &pending_slot_kind))
    {
        _IgnoreSlot ignore_connection{};
        if (IsInputSlotKind(pending_slot_kind))
        {
            if (pending_node_id == input_node && strcmp(pending_slot_title, input_slot) == 0)
            {
                ignore_connection.node_id = output_node;
                ignore_connection.slot_name = output_slot;
                ignore_connection.slot_kind = OutputSlotKind(1);
            }
        }
        else
        {
            if (pending_node_id == output_node && strcmp(pending_slot_title, output_slot) == 0)
            {
                ignore_connection.node_id = input_node;
                ignore_connection.slot_name = input_slot;
                ignore_connection.slot_kind = InputSlotKind(1);
            }
        }
        if (ignore_connection.node_id)
        {
            if (!impl->ignore_connections.contains(ignore_connection))
                impl->ignore_connections.push_back(ignore_connection);
        }
    }

    return is_connected;
}